

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void write_to_buffer(DESCRIPTOR_DATA *d,char *txt,int length)

{
  int iVar1;
  int iVar2;
  char *__src;
  size_t sVar3;
  char *__dest;
  string_view fmt;
  
  if (length < 1) {
    sVar3 = strlen(txt);
    length = (int)sVar3;
  }
  if ((d->outtop == 0) && (d->fcommand == false)) {
    *d->outbuf = '\n';
    d->outbuf[1] = '\r';
    d->outtop = 2;
  }
  do {
    iVar1 = d->outtop;
    iVar2 = d->outsize;
    if (length + iVar1 < iVar2) {
      strcpy(d->outbuf + iVar1,txt);
      d->outtop = d->outtop + length;
      return;
    }
    if (iVar2 < 32000) {
      d->outsize = (int)((long)iVar2 * 2);
      __dest = (char *)operator_new__((long)iVar2 * 2);
      __src = d->outbuf;
      strncpy(__dest,__src,(long)iVar1);
      if (__src != (char *)0x0) {
        operator_delete__(__src);
      }
      d->outbuf = __dest;
    }
    else {
      fmt._M_str = "Buffer overflow. Closing.\n\r";
      fmt._M_len = 0x1b;
      CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
      d->outtop = 0;
      close_socket(d);
    }
  } while (iVar2 < 32000);
  return;
}

Assistant:

void write_to_buffer(DESCRIPTOR_DATA *d, const char *txt, int length)
{
	/*
	 * Find length in case caller didn't.
	 */
	if (length <= 0)
		length = strlen(txt);

	/*
	 * Initial \n\r if needed.
	 */
	if (d->outtop == 0 && !d->fcommand)
	{
		d->outbuf[0] = '\n';
		d->outbuf[1] = '\r';
		d->outtop = 2;
	}

	/*
	 * Expand the buffer as needed.
	 */
	while (d->outtop + length >= d->outsize)
	{
		char *outbuf;

		if (d->outsize >= 32000)
		{
			RS.Logger.Warn("Buffer overflow. Closing.\n\r");
			d->outtop = 0;
			close_socket(d);
			return;
		}

		d->outsize *= 2;
		outbuf = new char[d->outsize];
		strncpy(outbuf, d->outbuf, d->outtop);
		delete[] d->outbuf;
		d->outbuf = outbuf;
	}

	/*
	 * Copy.
	 */
	strcpy(d->outbuf + d->outtop, txt);
	d->outtop += length;
}